

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printLevelIndex(ktxLevelIndexEntry *levelIndex,ktx_uint32_t numLevels)

{
  ktx_uint64_t *pkVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0x40;
  if (numLevels < 0x40) {
    uVar2 = (ulong)numLevels;
  }
  pkVar1 = &levelIndex->uncompressedByteLength;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    fprintf(_stdout,"Level%u.byteOffset: %#lx\n",uVar3 & 0xffffffff,
            ((ktxLevelIndexEntry *)(pkVar1 + -2))->byteOffset);
    fprintf(_stdout,"Level%u.byteLength: %ld\n",uVar3 & 0xffffffff,pkVar1[-1]);
    fprintf(_stdout,"Level%u.uncompressedByteLength: %ld\n",uVar3 & 0xffffffff,*pkVar1);
    pkVar1 = pkVar1 + 3;
  }
  return;
}

Assistant:

void
printLevelIndex(ktxLevelIndexEntry levelIndex[], ktx_uint32_t numLevels)
{
    numLevels = MIN(MAX_NUM_LEVELS, numLevels); // Print at most 64 levels to stop parsing garbage
    for (ktx_uint32_t level = 0; level < numLevels; level++) {
    fprintf(stdout, "Level%u.byteOffset: %#" PRIx64 "\n", level,
            levelIndex[level].byteOffset);
    fprintf(stdout, "Level%u.byteLength: %" PRId64 "\n", level,
            levelIndex[level].byteLength);
    fprintf(stdout, "Level%u.uncompressedByteLength: %" PRId64 "\n", level,
            levelIndex[level].uncompressedByteLength);
    }
}